

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iarchive_suite.cpp
# Opt level: O2

void dynamic_suite::test_number(void)

{
  bool v;
  char input [4];
  variable value;
  iarchive in;
  char local_1cc [4];
  type local_1c8;
  undefined1 local_1a8;
  undefined8 local_190;
  type_conflict9 local_188;
  basic_iarchive<char> local_180;
  
  builtin_strncpy(local_1cc,"3.0",4);
  local_1c8._0_8_ = strlen(local_1cc);
  local_1c8._8_8_ = local_1cc;
  trial::protocol::json::basic_iarchive<char>::basic_iarchive
            (&local_180,(view_type *)&local_1c8.__align);
  local_1a8 = 0;
  local_1c8._0_8_ = local_1c8._0_8_ & 0xffffffff00000000;
  trial::protocol::json::basic_iarchive<char>::
  load_override<trial::dynamic::basic_variable<std::allocator<char>>>
            (&local_180,(basic_variable<std::allocator<char>_> *)&local_1c8.__align);
  v = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::real>
                ((basic_variable<std::allocator<char>_> *)&local_1c8.__align);
  boost::detail::test_impl
            ("value.is<real>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/iarchive_suite.cpp"
             ,0x2c8,"void dynamic_suite::test_number()",v);
  local_188 = trial::dynamic::basic_variable<std::allocator<char>_>::value<double>
                        ((basic_variable<std::allocator<char>_> *)&local_1c8.__align);
  local_190 = 0x4008000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("value.value<double>()","3.0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/iarchive_suite.cpp"
             ,0x2c9,"void dynamic_suite::test_number()",&local_188,&local_190);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
  ::~small_union((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
                  *)&local_1c8.__align);
  trial::protocol::json::basic_iarchive<char>::~basic_iarchive(&local_180);
  return;
}

Assistant:

void test_number()
{
    const char input[] = "3.0";
    json::iarchive in(input);
    variable value;
    TRIAL_PROTOCOL_TEST_NO_THROW(in >> value);
    TRIAL_PROTOCOL_TEST(value.is<real>());
    TRIAL_PROTOCOL_TEST_EQUAL(value.value<double>(), 3.0);
}